

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O0

LispPTR subr_gettime(LispPTR *args)

{
  uint uVar1;
  LispPTR *pLVar2;
  uint *NAddr;
  int *fixpp;
  int result;
  LispPTR *args_local;
  
  uVar1 = gettime(*args & 0xffff);
  if (args[1] == 0) {
    if (uVar1 >> 0x10 == 0xffff) {
      args_local._4_4_ = uVar1 & 0xffff | 0xf0000;
    }
    else if (uVar1 >> 0x10 == 0) {
      args_local._4_4_ = uVar1 | 0xe0000;
    }
    else {
      NAddr = (uint *)createcell68k(2);
      *NAddr = uVar1;
      args_local._4_4_ = LAddrFromNative(NAddr);
    }
  }
  else {
    pLVar2 = NativeAligned4FromLAddr(args[1]);
    *pLVar2 = uVar1;
    args_local._4_4_ = args[1];
  }
  return args_local._4_4_;
}

Assistant:

LispPTR subr_gettime(LispPTR args[])
{
  int result;
  result = gettime(args[0] & 0xffff);
  if (args[1]) {
    *((int *)NativeAligned4FromLAddr(args[1])) = result;
    return (args[1]);
  } else
    N_ARITH_SWITCH(result);
}